

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  _Base_ptr p_Var7;
  SourceFileFlags SVar8;
  string local_48;
  
  ConstructSourceFileFlags(this);
  p_Var5 = (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(cmSourceFile **)(p_Var5 + 1) >= sf) {
        p_Var7 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(cmSourceFile **)(p_Var5 + 1) < sf];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(cmSourceFile **)(p_Var7 + 1) <= sf)) {
      uVar6 = (ulong)*(uint *)&p_Var7[1]._M_parent;
      p_Var5 = p_Var7[1]._M_left;
      goto LAB_00295312;
    }
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"MACOSX_PACKAGE_LOCATION","");
  p_Var5 = (_Base_ptr)cmSourceFile::GetProperty(sf,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (p_Var5 == (_Base_ptr)0x0) {
    uVar6 = 0;
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])
                      (this->GlobalGenerator,this->Makefile);
    iVar4 = strcmp((char *)p_Var5,"Resources");
    if (iVar4 == 0) {
      if ((char)iVar3 != '\0') {
        p_Var5 = (_Base_ptr)0x51f1de;
      }
      uVar6 = 3;
    }
    else {
      bVar2 = cmsys::SystemTools::StringStartsWith((char *)p_Var5,"Resources/");
      uVar6 = 5;
      if (bVar2) {
        if ((char)iVar3 != '\0') {
          p_Var5 = (_Base_ptr)((long)&p_Var5->_M_parent + 2);
        }
        uVar6 = 4;
      }
    }
  }
LAB_00295312:
  SVar8.MacFolder = (char *)p_Var5;
  SVar8._0_8_ = uVar6;
  return SVar8;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  std::map<cmSourceFile const*, SourceFileFlags>::iterator si =
    this->SourceFlagsMap.find(sf);
  if (si != this->SourceFlagsMap.end()) {
    flags = si->second;
  } else {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if (const char* location = sf->GetProperty("MACOSX_PACKAGE_LOCATION")) {
      flags.MacFolder = location;
      const bool stripResources =
        this->GlobalGenerator->ShouldStripResourcePath(this->Makefile);
      if (strcmp(location, "Resources") == 0) {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        if (stripResources) {
          flags.MacFolder = "";
        }
      } else if (cmSystemTools::StringStartsWith(location, "Resources/")) {
        flags.Type = cmGeneratorTarget::SourceFileTypeDeepResource;
        if (stripResources) {
          flags.MacFolder += strlen("Resources/");
        }
      } else {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
      }
    }
  }
  return flags;
}